

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error ps_builder_start_point(PS_Builder *builder,FT_Pos x,FT_Pos y)

{
  FT_Outline *pFVar1;
  FT_GlyphLoader loader;
  short sVar2;
  FT_Error FVar3;
  
  if (builder->path_begun != '\0') {
    return 0;
  }
  builder->path_begun = '\x01';
  pFVar1 = builder->current;
  if (pFVar1 == (FT_Outline *)0x0) {
    return 3;
  }
  if (builder->load_points != '\0') {
    loader = builder->loader;
    if ((loader->max_contours <
         (int)(loader->base).outline.n_contours + (int)(loader->current).outline.n_contours + 1U) &&
       (FVar3 = FT_GlyphLoader_CheckPoints(loader,0,1), FVar3 != 0)) {
      return FVar3;
    }
    sVar2 = pFVar1->n_contours;
    if (sVar2 < 1) goto LAB_002084a4;
    pFVar1->contours[(int)sVar2 - 1] = pFVar1->n_points + -1;
  }
  sVar2 = pFVar1->n_contours;
LAB_002084a4:
  pFVar1->n_contours = sVar2 + 1;
  FVar3 = ps_builder_add_point1(builder,x,y);
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_builder_start_point( PS_Builder*  builder,
                          FT_Pos       x,
                          FT_Pos       y )
  {
    FT_Error  error = FT_Err_Ok;


    /* test whether we are building a new contour */
    if ( !builder->path_begun )
    {
      builder->path_begun = 1;
      error = ps_builder_add_contour( builder );
      if ( !error )
        error = ps_builder_add_point1( builder, x, y );
    }

    return error;
  }